

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManDfsForCrossCut_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar1 = *(ulong *)pObj;
  uVar3 = (uint)uVar1;
  if ((~uVar3 & 0x9fffffff) != 0) {
    uVar4 = uVar1 & 0x1fffffff;
    if ((int)uVar3 < 0 && uVar4 != 0x1fffffff) {
      pObj[-uVar4].Value = pObj[-uVar4].Value + 1;
    }
    else {
      if (((int)uVar3 < 0) || ((int)uVar4 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                      ,0x327,"void Gia_ManDfsForCrossCut_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                     );
      }
      pObj[-uVar4].Value = pObj[-uVar4].Value + 1;
      pObj[-(uVar1 >> 0x20 & 0x1fffffff)].Value = pObj[-(uVar1 >> 0x20 & 0x1fffffff)].Value + 1;
      Gia_ManDfsForCrossCut_rec(p,pObj + -uVar4,vNodes);
      uVar4 = (ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff;
    }
    Gia_ManDfsForCrossCut_rec(p,(Gia_Obj_t *)(&pObj->field_0x0 + uVar4 * -0xc),vNodes);
  }
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(vNodes,iVar2);
  return;
}

Assistant:

void Gia_ManDfsForCrossCut_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    if ( Gia_ObjIsCo(pObj) )
    {
        Gia_ObjFanin0(pObj)->Value++;
        Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjFanin0(pObj)->Value++;
    Gia_ObjFanin1(pObj)->Value++;
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Gia_ManDfsForCrossCut_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}